

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io-unix.c++
# Opt level: O0

CapabilityPipe * __thiscall
kj::anon_unknown_30::AsyncIoProviderImpl::newCapabilityPipe
          (CapabilityPipe *__return_storage_ptr__,AsyncIoProviderImpl *this)

{
  int osErrorNumber;
  void *pvVar1;
  Fault local_40;
  Fault f;
  SyscallResult local_28;
  undefined1 local_24 [4];
  SyscallResult _kjSyscallResult;
  int type;
  int fds [2];
  AsyncIoProviderImpl *this_local;
  
  local_24 = (undefined1  [4])0x80801;
  f.exception = (Exception *)local_24;
  local_28 = _::Debug::
             syscall<kj::(anonymous_namespace)::AsyncIoProviderImpl::newCapabilityPipe()::_lambda()_1_>
                       ((anon_class_16_2_63434d86 *)&f,false);
  pvVar1 = _::Debug::SyscallResult::operator_cast_to_void_(&local_28);
  if (pvVar1 != (void *)0x0) {
    (*this->lowLevel->_vptr_LowLevelAsyncIoProvider[3])
              (__return_storage_ptr__,this->lowLevel,(ulong)(uint)_kjSyscallResult.errorNumber,7);
    (*this->lowLevel->_vptr_LowLevelAsyncIoProvider[3])
              (__return_storage_ptr__->ends + 1,this->lowLevel,(ulong)(uint)type,7);
    return __return_storage_ptr__;
  }
  osErrorNumber = _::Debug::SyscallResult::getErrorNumber(&local_28);
  _::Debug::Fault::Fault
            (&local_40,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async-io-unix.c++"
             ,0x600,osErrorNumber,"socketpair(AF_UNIX, type, 0, fds)","");
  _::Debug::Fault::fatal(&local_40);
}

Assistant:

CapabilityPipe newCapabilityPipe() override {
    int fds[2];
    int type = SOCK_STREAM;
#if __linux__ && !__BIONIC__
    type |= SOCK_NONBLOCK | SOCK_CLOEXEC;
#endif
    KJ_SYSCALL(socketpair(AF_UNIX, type, 0, fds));
    return CapabilityPipe { {
      lowLevel.wrapUnixSocketFd(fds[0], NEW_FD_FLAGS),
      lowLevel.wrapUnixSocketFd(fds[1], NEW_FD_FLAGS)
    } };
  }